

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onEnterFunctionDeclarationExpressionAstNode
          (CompilerAstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  bool bVar1;
  _Atomic_word *this_00;
  __shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  element_type *var_00;
  element_type *this_02;
  size_type sVar3;
  shared_ptr<Token> *var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *__range2;
  shared_ptr<compiler::EmissionContext> ec;
  FunctionDeclarationExpressionAstNode *node_local;
  CompilerAstWalker *this_local;
  
  ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  std::make_shared<compiler::EmissionContext,std::shared_ptr<compiler::EmissionContext>&>
            ((shared_ptr<compiler::EmissionContext> *)&__range2);
  this_00 = &(ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count;
  __end2 = std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::begin
                     ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                      this_00);
  var = (shared_ptr<Token> *)
        std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::end
                  ((vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
                   this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<Token>_*,_std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>_>
                                *)&var);
    if (!bVar1) break;
    this_01 = (__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<Token>_*,_std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>_>
              ::operator*(&__end2);
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range2);
    var_00 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_01);
    EmissionContext::Declare(peVar2,&var_00->value);
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range2);
    this_02 = std::
              __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&__range2);
    sVar3 = std::
            vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>::
            size(&this_02->variables);
    EmissionContext::FullyBind(peVar2,sVar3 - 1);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Token>_*,_std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>_>
    ::operator++(&__end2);
  }
  std::shared_ptr<compiler::EmissionContext>::operator=
            (&this->ec,(shared_ptr<compiler::EmissionContext> *)&__range2);
  std::shared_ptr<compiler::EmissionContext>::~shared_ptr
            ((shared_ptr<compiler::EmissionContext> *)&__range2);
  return;
}

Assistant:

void onEnterFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {
    auto ec = std::make_shared<compiler::EmissionContext>(this->ec);

    for (const auto& var : node->parameters) {
      ec->Declare(var->value);
      // immediately fully bind all parameters as are never half-declared
      ec->FullyBind(ec->variables.size() - 1);
    }

    this->ec = ec;
  }